

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Model::clear_Type(Model *this)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  SupportVectorClassifier *this_00;
  ulong uStack_20;
  
  uVar1 = this->_oneof_case_[0];
  switch(uVar1) {
  case 600:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).onehotencoder_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      OneHotEncoder::~OneHotEncoder((OneHotEncoder *)this_00);
    }
    goto LAB_001c82f3;
  case 0x259:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).imputer_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      Imputer::~Imputer((Imputer *)this_00);
    }
    goto LAB_001c8289;
  case 0x25a:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).featurevectorizer_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      FeatureVectorizer::~FeatureVectorizer((FeatureVectorizer *)this_00);
    }
    goto LAB_001c8289;
  case 0x25b:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).dictvectorizer_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      DictVectorizer::~DictVectorizer((DictVectorizer *)this_00);
    }
    goto LAB_001c83bd;
  case 0x25c:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).scaler_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      Scaler::~Scaler((Scaler *)this_00);
    }
    goto LAB_001c81b6;
  case 0x25d:
  case 0x260:
    goto switchD_001c7c3e_caseD_25d;
  case 0x25e:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).categoricalmapping_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      CategoricalMapping::~CategoricalMapping((CategoricalMapping *)this_00);
    }
LAB_001c8289:
    uStack_20 = 0x30;
    break;
  case 0x25f:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).normalizer_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      Normalizer::~Normalizer((Normalizer *)this_00);
    }
LAB_001c8328:
    uStack_20 = 0x18;
    break;
  case 0x261:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).arrayfeatureextractor_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      ArrayFeatureExtractor::~ArrayFeatureExtractor((ArrayFeatureExtractor *)this_00);
    }
LAB_001c82f3:
    uStack_20 = 0x28;
    break;
  case 0x262:
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
    this_00 = (SupportVectorClassifier *)(this->Type_).nonmaximumsuppression_;
    if (this_00 != (SupportVectorClassifier *)0x0) {
      NonMaximumSuppression::~NonMaximumSuppression((NonMaximumSuppression *)this_00);
    }
LAB_001c7f2e:
    uStack_20 = 0x70;
    break;
  default:
    switch(uVar1) {
    case 2000:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
      this_00 = (SupportVectorClassifier *)(this->Type_).textclassifier_;
      if (this_00 != (SupportVectorClassifier *)0x0) {
        CoreMLModels::TextClassifier::~TextClassifier((TextClassifier *)this_00);
      }
      goto LAB_001c81b6;
    case 0x7d1:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
      this_00 = (SupportVectorClassifier *)(this->Type_).wordtagger_;
      if (this_00 != (SupportVectorClassifier *)0x0) {
        CoreMLModels::WordTagger::~WordTagger((WordTagger *)this_00);
      }
LAB_001c83eb:
      uStack_20 = 0x58;
      goto LAB_001c83ee;
    case 0x7d2:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
      this_00 = (SupportVectorClassifier *)(this->Type_).visionfeatureprint_;
      if (this_00 != (SupportVectorClassifier *)0x0) {
        CoreMLModels::VisionFeaturePrint::~VisionFeaturePrint((VisionFeaturePrint *)this_00);
      }
      break;
    case 0x7d3:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
      this_00 = (SupportVectorClassifier *)(this->Type_).soundanalysispreprocessing_;
      if (this_00 != (SupportVectorClassifier *)0x0) {
        CoreMLModels::SoundAnalysisPreprocessing::~SoundAnalysisPreprocessing
                  ((SoundAnalysisPreprocessing *)this_00);
      }
      break;
    case 0x7d4:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
      this_00 = (SupportVectorClassifier *)(this->Type_).gazetteer_;
      if (this_00 != (SupportVectorClassifier *)0x0) {
        CoreMLModels::Gazetteer::~Gazetteer((Gazetteer *)this_00);
      }
LAB_001c81b6:
      uStack_20 = 0x38;
      goto LAB_001c83ee;
    case 0x7d5:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
      this_00 = (SupportVectorClassifier *)(this->Type_).wordembedding_;
      if (this_00 != (SupportVectorClassifier *)0x0) {
        CoreMLModels::WordEmbedding::~WordEmbedding((WordEmbedding *)this_00);
      }
      goto LAB_001c82f3;
    case 0x7d6:
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar3 = (undefined8 *)*puVar3;
      }
      if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
      this_00 = (SupportVectorClassifier *)(this->Type_).audiofeatureprint_;
      if (this_00 != (SupportVectorClassifier *)0x0) {
        CoreMLModels::AudioFeaturePrint::~AudioFeaturePrint((AudioFeaturePrint *)this_00);
      }
      break;
    default:
      switch(uVar1) {
      case 300:
        uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar3 = (undefined8 *)*puVar3;
        }
        if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
        this_00 = (SupportVectorClassifier *)(this->Type_).glmregressor_;
        if (this_00 != (SupportVectorClassifier *)0x0) {
          GLMRegressor::~GLMRegressor((GLMRegressor *)this_00);
        }
        uStack_20 = 0x40;
        break;
      case 0x12d:
        uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar3 = (undefined8 *)*puVar3;
        }
        if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
        this_00 = (SupportVectorClassifier *)(this->Type_).supportvectorregressor_;
        if (this_00 != (SupportVectorClassifier *)0x0) {
          SupportVectorRegressor::~SupportVectorRegressor((SupportVectorRegressor *)this_00);
        }
        goto LAB_001c81b6;
      case 0x12e:
        uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar3 = (undefined8 *)*puVar3;
        }
        if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
        this_00 = (SupportVectorClassifier *)(this->Type_).treeensembleregressor_;
        if (this_00 != (SupportVectorClassifier *)0x0) {
          TreeEnsembleRegressor::~TreeEnsembleRegressor((TreeEnsembleRegressor *)this_00);
        }
        goto LAB_001c83bd;
      case 0x12f:
        uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar3 = (undefined8 *)*puVar3;
        }
        if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
        this_00 = (SupportVectorClassifier *)(this->Type_).neuralnetworkregressor_;
        if (this_00 != (SupportVectorClassifier *)0x0) {
          NeuralNetworkRegressor::~NeuralNetworkRegressor((NeuralNetworkRegressor *)this_00);
        }
        goto LAB_001c83eb;
      case 0x130:
        uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
        puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar3 = (undefined8 *)*puVar3;
        }
        if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
        this_00 = (SupportVectorClassifier *)(this->Type_).bayesianprobitregressor_;
        if (this_00 != (SupportVectorClassifier *)0x0) {
          BayesianProbitRegressor::~BayesianProbitRegressor((BayesianProbitRegressor *)this_00);
        }
        uStack_20 = 0x78;
        break;
      default:
        switch(uVar1) {
        case 400:
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar3 = (undefined8 *)*puVar3;
          }
          if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
          this_00 = (SupportVectorClassifier *)(this->Type_).glmclassifier_;
          if (this_00 != (SupportVectorClassifier *)0x0) {
            GLMClassifier::~GLMClassifier((GLMClassifier *)this_00);
          }
          uStack_20 = 0x50;
          break;
        case 0x191:
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar3 = (undefined8 *)*puVar3;
          }
          if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
          this_00 = (this->Type_).supportvectorclassifier_;
          if (this_00 != (SupportVectorClassifier *)0x0) {
            SupportVectorClassifier::~SupportVectorClassifier(this_00);
          }
          uStack_20 = 0x98;
          break;
        case 0x192:
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar3 = (undefined8 *)*puVar3;
          }
          if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
          this_00 = (SupportVectorClassifier *)(this->Type_).treeensembleclassifier_;
          if (this_00 != (SupportVectorClassifier *)0x0) {
            TreeEnsembleClassifier::~TreeEnsembleClassifier((TreeEnsembleClassifier *)this_00);
          }
          goto LAB_001c8289;
        case 0x193:
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar3 = (undefined8 *)*puVar3;
          }
          if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
          this_00 = (SupportVectorClassifier *)(this->Type_).neuralnetworkclassifier_;
          if (this_00 != (SupportVectorClassifier *)0x0) {
            NeuralNetworkClassifier::~NeuralNetworkClassifier((NeuralNetworkClassifier *)this_00);
          }
          uStack_20 = 0x68;
          break;
        case 0x194:
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar3 = (undefined8 *)*puVar3;
          }
          if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
          this_00 = (SupportVectorClassifier *)(this->Type_).knearestneighborsclassifier_;
          if (this_00 != (SupportVectorClassifier *)0x0) {
            KNearestNeighborsClassifier::~KNearestNeighborsClassifier
                      ((KNearestNeighborsClassifier *)this_00);
          }
          goto LAB_001c8113;
        default:
          if (uVar1 == 3000) {
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              puVar3 = (undefined8 *)*puVar3;
            }
            if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
            this_00 = (SupportVectorClassifier *)(this->Type_).serializedmodel_;
            if (this_00 != (SupportVectorClassifier *)0x0) {
              SerializedModel::~SerializedModel((SerializedModel *)this_00);
            }
            goto LAB_001c82f3;
          }
          if (uVar1 == 0xc9) {
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              puVar3 = (undefined8 *)*puVar3;
            }
            if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
            this_00 = (SupportVectorClassifier *)(this->Type_).pipelineregressor_;
            if (this_00 != (SupportVectorClassifier *)0x0) {
              PipelineRegressor::~PipelineRegressor((PipelineRegressor *)this_00);
            }
            goto LAB_001c83bd;
          }
          if (uVar1 != 0xca) {
            if (uVar1 == 500) {
              uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
              puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
              if ((uVar2 & 1) != 0) {
                puVar3 = (undefined8 *)*puVar3;
              }
              if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
              this_00 = (SupportVectorClassifier *)(this->Type_).neuralnetwork_;
              if (this_00 != (SupportVectorClassifier *)0x0) {
                NeuralNetwork::~NeuralNetwork((NeuralNetwork *)this_00);
              }
            }
            else {
              if (uVar1 == 0x1f5) {
                uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
                puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
                if ((uVar2 & 1) != 0) {
                  puVar3 = (undefined8 *)*puVar3;
                }
                if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
                this_00 = (SupportVectorClassifier *)(this->Type_).itemsimilarityrecommender_;
                if (this_00 != (SupportVectorClassifier *)0x0) {
                  ItemSimilarityRecommender::~ItemSimilarityRecommender
                            ((ItemSimilarityRecommender *)this_00);
                }
                goto LAB_001c7f2e;
              }
              if (uVar1 == 0x1f6) {
                uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
                puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
                if ((uVar2 & 1) != 0) {
                  puVar3 = (undefined8 *)*puVar3;
                }
                if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
                this_00 = (SupportVectorClassifier *)(this->Type_).mlprogram_;
                if (this_00 != (SupportVectorClassifier *)0x0) {
                  MILSpec::Program::~Program((Program *)this_00);
                }
                uStack_20 = 0x88;
                break;
              }
              if (uVar1 != 0x22b) {
                if (uVar1 == 0x22c) {
                  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
                  puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
                  if ((uVar2 & 1) != 0) {
                    puVar3 = (undefined8 *)*puVar3;
                  }
                  if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
                  this_00 = (SupportVectorClassifier *)(this->Type_).linkedmodel_;
                  if (this_00 != (SupportVectorClassifier *)0x0) {
                    LinkedModel::~LinkedModel((LinkedModel *)this_00);
                  }
                }
                else {
                  if (uVar1 == 0x230) {
                    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
                    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
                    if ((uVar2 & 1) != 0) {
                      puVar3 = (undefined8 *)*puVar3;
                    }
                    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
                    this_00 = (SupportVectorClassifier *)(this->Type_).classconfidencethresholding_;
                    if (this_00 != (SupportVectorClassifier *)0x0) {
                      ClassConfidenceThresholding::~ClassConfidenceThresholding
                                ((ClassConfidenceThresholding *)this_00);
                    }
                    goto LAB_001c8289;
                  }
                  if (uVar1 == 900) {
                    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
                    puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
                    if ((uVar2 & 1) != 0) {
                      puVar3 = (undefined8 *)*puVar3;
                    }
                    if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
                    this_00 = (SupportVectorClassifier *)(this->Type_).identity_;
                    if (this_00 != (SupportVectorClassifier *)0x0) {
                      Identity::~Identity((Identity *)this_00);
                    }
                    goto LAB_001c8328;
                  }
                  if (uVar1 != 200) goto switchD_001c7c3e_caseD_25d;
                  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
                  puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
                  if ((uVar2 & 1) != 0) {
                    puVar3 = (undefined8 *)*puVar3;
                  }
                  if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
                  this_00 = (SupportVectorClassifier *)(this->Type_).pipelineclassifier_;
                  if (this_00 != (SupportVectorClassifier *)0x0) {
                    PipelineClassifier::~PipelineClassifier((PipelineClassifier *)this_00);
                  }
                }
                goto LAB_001c83bd;
              }
              uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
              puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
              if ((uVar2 & 1) != 0) {
                puVar3 = (undefined8 *)*puVar3;
              }
              if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
              this_00 = (SupportVectorClassifier *)(this->Type_).custommodel_;
              if (this_00 != (SupportVectorClassifier *)0x0) {
                CustomModel::~CustomModel((CustomModel *)this_00);
              }
            }
            goto LAB_001c83eb;
          }
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar3 = (undefined8 *)*puVar3;
          }
          if (puVar3 != (undefined8 *)0x0) goto switchD_001c7c3e_caseD_25d;
          this_00 = (SupportVectorClassifier *)(this->Type_).pipeline_;
          if (this_00 != (SupportVectorClassifier *)0x0) {
            Pipeline::~Pipeline((Pipeline *)this_00);
          }
LAB_001c8113:
          uStack_20 = 0x48;
        }
      }
      goto LAB_001c83ee;
    }
LAB_001c83bd:
    uStack_20 = 0x20;
  }
LAB_001c83ee:
  operator_delete(this_00,uStack_20);
switchD_001c7c3e_caseD_25d:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Model::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Model)
  switch (Type_case()) {
    case kPipelineClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipelineclassifier_;
      }
      break;
    }
    case kPipelineRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipelineregressor_;
      }
      break;
    }
    case kPipeline: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.pipeline_;
      }
      break;
    }
    case kGlmRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.glmregressor_;
      }
      break;
    }
    case kSupportVectorRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.supportvectorregressor_;
      }
      break;
    }
    case kTreeEnsembleRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.treeensembleregressor_;
      }
      break;
    }
    case kNeuralNetworkRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetworkregressor_;
      }
      break;
    }
    case kBayesianProbitRegressor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.bayesianprobitregressor_;
      }
      break;
    }
    case kGlmClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.glmclassifier_;
      }
      break;
    }
    case kSupportVectorClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.supportvectorclassifier_;
      }
      break;
    }
    case kTreeEnsembleClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.treeensembleclassifier_;
      }
      break;
    }
    case kNeuralNetworkClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetworkclassifier_;
      }
      break;
    }
    case kKNearestNeighborsClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.knearestneighborsclassifier_;
      }
      break;
    }
    case kNeuralNetwork: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.neuralnetwork_;
      }
      break;
    }
    case kItemSimilarityRecommender: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.itemsimilarityrecommender_;
      }
      break;
    }
    case kMlProgram: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.mlprogram_;
      }
      break;
    }
    case kCustomModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.custommodel_;
      }
      break;
    }
    case kLinkedModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.linkedmodel_;
      }
      break;
    }
    case kClassConfidenceThresholding: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.classconfidencethresholding_;
      }
      break;
    }
    case kOneHotEncoder: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.onehotencoder_;
      }
      break;
    }
    case kImputer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.imputer_;
      }
      break;
    }
    case kFeatureVectorizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.featurevectorizer_;
      }
      break;
    }
    case kDictVectorizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.dictvectorizer_;
      }
      break;
    }
    case kScaler: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.scaler_;
      }
      break;
    }
    case kCategoricalMapping: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.categoricalmapping_;
      }
      break;
    }
    case kNormalizer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.normalizer_;
      }
      break;
    }
    case kArrayFeatureExtractor: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.arrayfeatureextractor_;
      }
      break;
    }
    case kNonMaximumSuppression: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.nonmaximumsuppression_;
      }
      break;
    }
    case kIdentity: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.identity_;
      }
      break;
    }
    case kTextClassifier: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.textclassifier_;
      }
      break;
    }
    case kWordTagger: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.wordtagger_;
      }
      break;
    }
    case kVisionFeaturePrint: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.visionfeatureprint_;
      }
      break;
    }
    case kSoundAnalysisPreprocessing: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.soundanalysispreprocessing_;
      }
      break;
    }
    case kGazetteer: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.gazetteer_;
      }
      break;
    }
    case kWordEmbedding: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.wordembedding_;
      }
      break;
    }
    case kAudioFeaturePrint: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.audiofeatureprint_;
      }
      break;
    }
    case kSerializedModel: {
      if (GetArenaForAllocation() == nullptr) {
        delete Type_.serializedmodel_;
      }
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}